

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBoxPrivate::connectModel(QComboBoxPrivate *this)

{
  long lVar1;
  long in_RDI;
  long in_FS_OFFSET;
  code *pcVar2;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 uVar3;
  undefined8 in_stack_fffffffffffffee0;
  ConnectionType CVar4;
  Object *in_stack_fffffffffffffee8;
  Object *receiverPrivate;
  Object *in_stack_fffffffffffffef0;
  code *sender;
  Function in_stack_ffffffffffffff10;
  code *slot;
  code *signal;
  
  CVar4 = (ConnectionType)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0x298) != 0) {
    signal = QAbstractItemModel::dataChanged;
    uVar3 = 0;
    QObjectPrivate::
    connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),void(QComboBoxPrivate::*)(QModelIndex_const&,QModelIndex_const&)>
              (in_stack_fffffffffffffef0,
               (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::dataChanged,
               in_stack_fffffffffffffee8,in_stack_ffffffffffffff10,CVar4);
    slot = QAbstractItemModel::rowsAboutToBeInserted;
    pcVar2 = updateIndexBeforeChange;
    QObjectPrivate::
    connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QComboBoxPrivate::*)()>
              (in_stack_fffffffffffffef0,(offset_in_QAbstractItemModel_to_subr)signal,
               in_stack_fffffffffffffee8,(Function)QAbstractItemModel::rowsAboutToBeInserted,CVar4);
    QObjectPrivate::
    connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QComboBoxPrivate::*)(QModelIndex_const&,int,int)>
              (in_stack_fffffffffffffef0,(offset_in_QAbstractItemModel_to_subr)signal,
               in_stack_fffffffffffffee8,(Function)slot,CVar4);
    sender = QAbstractItemModel::rowsAboutToBeRemoved;
    QObjectPrivate::
    connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QComboBoxPrivate::*)()>
              ((Object *)QAbstractItemModel::rowsAboutToBeRemoved,
               (offset_in_QAbstractItemModel_to_subr)signal,in_stack_fffffffffffffee8,(Function)slot
               ,CVar4);
    CVar4 = AutoConnection;
    receiverPrivate = (Object *)0x0;
    QObjectPrivate::
    connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QComboBoxPrivate::*)(QModelIndex_const&,int,int)>
              ((Object *)sender,(offset_in_QAbstractItemModel_to_subr)signal,(Object *)0x0,
               (Function)slot,AutoConnection);
    QObjectPrivate::connect<void(QObject::*)(QObject*),void(QComboBoxPrivate::*)()>
              ((Object *)sender,(offset_in_QObject_to_subr)signal,receiverPrivate,(Function)slot,
               CVar4);
    QObjectPrivate::
    connect<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal),void(QComboBoxPrivate::*)()>
              ((Object *)sender,(offset_in_QAbstractItemModel_to_subr)signal,receiverPrivate,
               (Function)slot,CVar4);
    QObjectPrivate::
    connect<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal),void(QComboBoxPrivate::*)()>
              ((Object *)sender,(offset_in_QAbstractItemModel_to_subr)signal,receiverPrivate,
               (Function)slot,CVar4);
    std::array<QMetaObject::Connection,_8UL>::operator=
              ((array<QMetaObject::Connection,_8UL> *)CONCAT44(uVar3,in_stack_fffffffffffffea0),
               (array<QMetaObject::Connection,_8UL> *)pcVar2);
    std::array<QMetaObject::Connection,_8UL>::~array
              ((array<QMetaObject::Connection,_8UL> *)CONCAT44(uVar3,in_stack_fffffffffffffea0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBoxPrivate::connectModel()
{
    if (!model)
        return;

    modelConnections = {
        QObjectPrivate::connect(model, &QAbstractItemModel::dataChanged,
                                this, &QComboBoxPrivate::dataChanged),
        QObjectPrivate::connect(model, &QAbstractItemModel::rowsAboutToBeInserted,
                                this, &QComboBoxPrivate::updateIndexBeforeChange),
        QObjectPrivate::connect(model, &QAbstractItemModel::rowsInserted,
                                this, &QComboBoxPrivate::rowsInserted),
        QObjectPrivate::connect(model, &QAbstractItemModel::rowsAboutToBeRemoved,
                                this, &QComboBoxPrivate::updateIndexBeforeChange),
        QObjectPrivate::connect(model, &QAbstractItemModel::rowsRemoved,
                                this, &QComboBoxPrivate::rowsRemoved),
        QObjectPrivate::connect(model, &QObject::destroyed,
                                this, &QComboBoxPrivate::modelDestroyed),
        QObjectPrivate::connect(model, &QAbstractItemModel::modelAboutToBeReset,
                                this, &QComboBoxPrivate::updateIndexBeforeChange),
        QObjectPrivate::connect(model, &QAbstractItemModel::modelReset,
                                this, &QComboBoxPrivate::modelReset)
    };
}